

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O1

int format_octal(int64_t v,char *p,int s)

{
  size_t sVar1;
  size_t __n;
  int iVar2;
  ulong uVar3;
  size_t __n_00;
  
  __n_00 = 0;
  sVar1 = 8;
  do {
    uVar3 = v;
    p[sVar1 - 1] = (byte)uVar3 & 7 | 0x30;
    __n = sVar1 - 1;
    __n_00 = __n_00 + 1;
    if ((uint)sVar1 < 2) break;
    sVar1 = __n;
    v = uVar3 >> 3;
  } while (7 < uVar3);
  if (uVar3 < 8) {
    memmove(p,p + __n,__n_00);
    iVar2 = 0;
    if (1 < 9 - (int)__n_00) {
      memset(p + __n_00,0x20,__n);
      iVar2 = 0;
    }
  }
  else {
    builtin_strncpy(p + __n,"77777777",8);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
format_octal(int64_t v, char *p, int s)
{
	int len;

	len = s;

	/* Octal values can't be negative, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;		/* Start at the end and work backwards. */
	while (s-- > 0) {
		*--p = (char)('0' + (v & 7));
		v >>= 3;
	}

	if (v == 0)
		return (0);

	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '7';

	return (-1);
}